

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O3

void Of_ManAreaFlow(Of_Man_t *p)

{
  int iVar1;
  Of_Obj_t *pOVar2;
  Gia_Man_t *pGVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  int *piVar7;
  long lVar8;
  uint *puVar9;
  ulong uVar10;
  bool bVar11;
  
  if (p->pGia->pRefs != (int *)0x0) {
    __assert_fail("p->pGia->pRefs == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaOf.c"
                  ,0xaf,"void Of_ManAreaFlow(Of_Man_t *)");
  }
  Gia_ManCreateRefs(p->pGia);
  pOVar2 = p->pObjs;
  pOVar2->Flow = 0;
  pGVar3 = p->pGia;
  lVar5 = (long)pGVar3->vCis->nSize;
  if (lVar5 < 1) {
    uVar6 = pGVar3->nObjs;
    if ((int)uVar6 < 1) goto LAB_0073b89e;
  }
  else {
    piVar7 = pGVar3->vCis->pArray;
    lVar8 = 0;
    do {
      iVar1 = piVar7[lVar8];
      if (((long)iVar1 < 0) || (uVar6 = pGVar3->nObjs, (int)uVar6 <= iVar1)) goto LAB_0073b8f3;
      if (iVar1 == 0) break;
      pOVar2[iVar1].Flow = 0;
      lVar8 = lVar8 + 1;
    } while (lVar5 != lVar8);
  }
  if (pGVar3->pObjs != (Gia_Obj_t *)0x0) {
    puVar9 = &pGVar3->pObjs->Value;
    piVar7 = &pOVar2->Flow;
    uVar10 = 0;
    do {
      uVar4 = *(ulong *)(puVar9 + -2);
      if ((uVar4 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar4) {
        *piVar7 = (*(int *)((long)puVar9 + (ulong)((uint)(uVar4 >> 0x1e) & 0x7ffffffc) * -3) +
                   *(int *)((long)puVar9 + (ulong)(uint)((int)(uVar4 & 0x1fffffff) << 2) * -3) +
                  1000U) / (uint)pGVar3->pRefs[uVar10];
      }
      uVar10 = uVar10 + 1;
      puVar9 = puVar9 + 3;
      piVar7 = piVar7 + 8;
    } while (uVar6 != uVar10);
  }
LAB_0073b89e:
  lVar5 = (long)pGVar3->vCos->nSize;
  if (0 < lVar5) {
    lVar8 = 0;
    do {
      iVar1 = pGVar3->vCos->pArray[lVar8];
      if ((iVar1 < 0) || ((int)uVar6 <= iVar1)) {
LAB_0073b8f3:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
    } while ((pGVar3->pObjs != (Gia_Obj_t *)0x0) &&
            (bVar11 = lVar5 + -1 != lVar8, lVar8 = lVar8 + 1, bVar11));
  }
  if (pGVar3->pRefs != (int *)0x0) {
    free(pGVar3->pRefs);
    p->pGia->pRefs = (int *)0x0;
  }
  return;
}

Assistant:

void Of_ManAreaFlow( Of_Man_t * p )
{
    int AreaUnit = 1000;
    int i, Id, Total = 0;
    Gia_Obj_t * pObj;
    assert( p->pGia->pRefs == NULL );
    Gia_ManCreateRefs( p->pGia );
    Of_ObjSetFlow( p, 0, 0 );
    Gia_ManForEachCiId( p->pGia, Id, i )
        Of_ObjSetFlow( p, Id, 0 );
    Gia_ManForEachAnd( p->pGia, pObj, Id )
        Of_ObjSetFlow( p, Id, (Gia_ObjFanin0(pObj)->Value + Gia_ObjFanin1(pObj)->Value + AreaUnit) / Gia_ObjRefNum(p->pGia, pObj) );
    Gia_ManForEachCo( p->pGia, pObj, i )
        Total += Gia_ObjFanin0(pObj)->Value;
    ABC_FREE( p->pGia->pRefs );
    if ( 1 )
        return;
    printf( "CI = %5d.  ", Gia_ManCiNum(p->pGia) );
    printf( "CO = %5d.  ", Gia_ManCoNum(p->pGia) );
    printf( "And = %8d.  ", Gia_ManAndNum(p->pGia) );
    printf( "Area = %8d.  ", Total/AreaUnit );
    printf( "\n" );
}